

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O1

int main(void)

{
  RandomDataProvider *pRVar1;
  RandomDataProvider *pRVar2;
  uchar buf [4];
  long r1;
  long r2;
  BogusRandomDataProvider brdp;
  SecureRandomDataProvider srdp;
  InsecureRandomDataProvider irdp;
  uchar local_54;
  char local_53;
  char local_52;
  char local_51;
  long local_50;
  long local_48;
  RandomDataProvider local_40;
  SecureRandomDataProvider local_38;
  InsecureRandomDataProvider local_30;
  
  pRVar1 = QUtil::getRandomDataProvider();
  local_50 = QUtil::random();
  local_48 = QUtil::random();
  if (local_50 == local_48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two randoms were the same\n",0x20);
  }
  InsecureRandomDataProvider::InsecureRandomDataProvider(&local_30);
  InsecureRandomDataProvider::provideRandomData(&local_30,(uchar *)&local_50,4);
  InsecureRandomDataProvider::provideRandomData(&local_30,(uchar *)&local_48,4);
  if (local_50 == local_48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two insecure randoms were the same\n",0x29);
  }
  local_38.super_RandomDataProvider._vptr_RandomDataProvider =
       (RandomDataProvider)&PTR__RandomDataProvider_002f2e30;
  SecureRandomDataProvider::provideRandomData(&local_38,(uchar *)&local_50,4);
  SecureRandomDataProvider::provideRandomData(&local_38,(uchar *)&local_48,4);
  if (local_50 == local_48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two secure randoms were the same\n",0x27);
  }
  local_40._vptr_RandomDataProvider = (_func_int **)&PTR__RandomDataProvider_002eda70;
  QUtil::setRandomDataProvider(&local_40);
  pRVar2 = QUtil::getRandomDataProvider();
  if (pRVar2 != &local_40) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: getRandomDataProvider didn\'t return our provider\n",
               0x37);
  }
  local_50 = QUtil::random();
  local_48 = QUtil::random();
  if (local_50 != local_48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: two bogus randoms were different\n",0x27);
  }
  QUtil::initializeWithRandomBytes(&local_54,4);
  if ((((local_54 != '\0') || (local_53 != '\x01')) || (local_52 != '\x02')) || (local_51 != '\x03')
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fail: bogus random didn\'t provide correct bytes\n",0x30);
  }
  QUtil::setRandomDataProvider((RandomDataProvider *)0x0);
  pRVar2 = QUtil::getRandomDataProvider();
  if (pRVar2 != pRVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "fail: passing null to setRandomDataProvider didn\'t reset the random data provider\n"
               ,0x52);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"random: end of tests\n",0x15);
  return 0;
}

Assistant:

int
main()
{
    RandomDataProvider* orig_rdp = QUtil::getRandomDataProvider();
    long r1 = QUtil::random();
    long r2 = QUtil::random();
    if (r1 == r2) {
        std::cout << "fail: two randoms were the same\n";
    }
    InsecureRandomDataProvider irdp;
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two insecure randoms were the same\n";
    }
#ifndef SKIP_OS_SECURE_RANDOM
    SecureRandomDataProvider srdp;
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two secure randoms were the same\n";
    }
#endif
    BogusRandomDataProvider brdp;
    QUtil::setRandomDataProvider(&brdp);
    if (QUtil::getRandomDataProvider() != &brdp) {
        std::cout << "fail: getRandomDataProvider didn't"
                     " return our provider\n";
    }
    r1 = QUtil::random();
    r2 = QUtil::random();
    if (r1 != r2) {
        std::cout << "fail: two bogus randoms were different\n";
    }
    unsigned char buf[4];
    QUtil::initializeWithRandomBytes(buf, 4);
    if (!((buf[0] == 0) && (buf[1] == 1) && (buf[2] == 2) && (buf[3] == 3))) {
        std::cout << "fail: bogus random didn't provide correct bytes\n";
    }
    QUtil::setRandomDataProvider(nullptr);
    if (QUtil::getRandomDataProvider() != orig_rdp) {
        std::cout << "fail: passing null to setRandomDataProvider "
                     "didn't reset the random data provider\n";
    }
    std::cout << "random: end of tests\n";
    return 0;
}